

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O0

void __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::collectBreakpointsMin
          (SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int *nBp,int *minIdx,int *idx,int nnz,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upp,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *low,BreakpointSource src)

{
  BreakpointSource BVar1;
  type_conflict5 tVar2;
  int iVar3;
  ulong *puVar4;
  Breakpoint *pBVar5;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  BreakpointSource in_stack_00000020;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int i;
  int *last;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  curVal;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minVal;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_10;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_9;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  undefined4 in_stack_fffffffffffff368;
  int in_stack_fffffffffffff36c;
  undefined4 in_stack_fffffffffffff370;
  int in_stack_fffffffffffff374;
  int in_stack_fffffffffffff378;
  BreakpointSource in_stack_fffffffffffff37c;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff380;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_be0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b60;
  undefined4 local_ae0;
  undefined1 local_adc [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a5c;
  undefined1 local_9dc [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_95c;
  undefined1 local_8dc [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_85c;
  undefined4 local_7dc;
  undefined1 local_7d8 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_758;
  ulong local_6d8;
  undefined1 local_6cc [256];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5cc;
  int local_54c;
  undefined1 local_548 [128];
  int *local_4c8;
  undefined1 local_4c0 [128];
  undefined1 local_440 [128];
  long local_3c0;
  int local_3b4;
  int *local_3b0;
  int *local_3a8;
  int *local_3a0;
  undefined8 local_390;
  undefined8 local_388;
  undefined1 *local_380;
  undefined8 local_378;
  ulong *local_370;
  undefined1 *local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  Breakpoint *local_338;
  undefined1 *local_330;
  long local_328;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  Breakpoint *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  Breakpoint *local_2b0;
  undefined8 local_2a8;
  ulong *local_2a0;
  undefined8 local_298;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_289;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_288;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_268;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_260;
  undefined1 *local_258;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_249;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_248;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_228;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_220;
  undefined1 *local_218;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_209;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_208;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e0;
  undefined1 *local_1d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1c9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  undefined1 *local_198;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_189;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_188;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_149;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_109;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_89;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_59;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_348 = local_440;
  local_3c0 = in_R9;
  local_3b4 = in_R8D;
  local_3b0 = in_RCX;
  local_3a8 = in_RDX;
  local_3a0 = in_RSI;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370));
  local_340 = local_4c0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370));
  if (*local_3a0 == 0) {
    local_388 = infinity();
    local_380 = local_548;
    local_390 = 0;
    local_298 = local_388;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffff380,
               (double)CONCAT44(in_stack_fffffffffffff37c,in_stack_fffffffffffff378),
               (type *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370));
  }
  else {
    local_338 = Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
                ::operator[]((Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
                              *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                             in_stack_fffffffffffff36c);
    local_330 = local_548;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
  }
  local_2f0 = local_440;
  local_2f8 = local_548;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
             (cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
  local_4c8 = local_3b0 + local_3b4;
  for (; local_3b0 < local_4c8; local_3b0 = local_3b0 + 1) {
    local_54c = *local_3b0;
    local_328 = local_3c0 + (long)local_54c * 0x80;
    local_320 = &local_5cc;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
    SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::epsilonZero((SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x79e700);
    if (tVar2) {
      puVar4 = (ulong *)infinity();
      local_6d8 = *puVar4 ^ 0x8000000000000000;
      local_368 = local_6cc;
      local_370 = &local_6d8;
      local_378 = 0;
      local_2a0 = local_370;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (in_stack_fffffffffffff380,
                 (double)CONCAT44(in_stack_fffffffffffff37c,in_stack_fffffffffffff378),
                 (type *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370));
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x79e7b9);
      if (tVar2) {
        local_100 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)(in_stack_00000018 + (long)local_54c * 0x80);
        local_108 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)(in_stack_00000008 + (long)local_54c * 0x80);
        local_f8 = &local_758;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_109,local_100,local_108);
        local_f0 = &local_758;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370));
        local_d8 = &local_758;
        local_e0 = local_100;
        local_e8 = local_108;
        boost::multiprecision::default_ops::
        eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                   (cpp_dec_float<200U,_int,_void> *)0x79e897);
        local_7dc = 0;
        tVar2 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffff37c,in_stack_fffffffffffff378),
                           (int *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370));
        if (tVar2) {
          local_1c0 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)(in_RDI + 0x1b0);
          local_1b8 = local_7d8;
          local_1c8 = &local_5cc;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_1c9,local_1c0,local_1c8);
          local_1b0 = local_7d8;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370));
          local_198 = local_7d8;
          local_1a0 = local_1c0;
          local_1a8 = local_1c8;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                     (cpp_dec_float<200U,_int,_void> *)0x79e97a);
        }
        else {
          local_140 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)(in_RDI + 0x1b0);
          local_138 = &local_85c;
          local_148 = &local_758;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_149,local_140,local_148);
          local_130 = &local_85c;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370));
          local_118 = &local_85c;
          local_120 = local_140;
          local_128 = local_148;
          boost::multiprecision::default_ops::
          eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                     (cpp_dec_float<200U,_int,_void> *)0x79ea39);
          local_1f8 = local_7d8;
          local_200 = &local_85c;
          local_208 = &local_5cc;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_209,local_200,local_208);
          local_1f0 = local_7d8;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370));
          local_1d8 = local_7d8;
          local_1e0 = local_200;
          local_1e8 = local_208;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                     (cpp_dec_float<200U,_int,_void> *)0x79eaf0);
        }
        local_300 = local_4c0;
        local_308 = local_7d8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
        iVar3 = local_54c;
        pBVar5 = Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
                 ::operator[]((Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
                               *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                              in_stack_fffffffffffff36c);
        BVar1 = in_stack_00000020;
        pBVar5->idx = iVar3;
        pBVar5 = Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
                 ::operator[]((Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
                               *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                              in_stack_fffffffffffff36c);
        pBVar5->src = BVar1;
        local_2b0 = Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
                    ::operator[]((Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
                                  *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                                 in_stack_fffffffffffff36c);
        local_2b8 = local_4c0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x79ebe2);
        if (tVar2) {
          local_2c0 = local_440;
          local_2c8 = local_4c0;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
          *local_3a8 = *local_3a0;
        }
        *local_3a0 = *local_3a0 + 1;
      }
    }
    else {
      SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::epsilonZero((SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
      local_20 = local_8dc;
      local_28 = &local_95c;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_29,local_28);
      local_10 = local_8dc;
      local_18 = local_28;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
      local_8 = local_8dc;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370));
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x79ecf3);
      if (tVar2) {
        in_stack_fffffffffffff380 =
             (cpp_dec_float<200U,_int,_void> *)(in_stack_00000010 + (long)local_54c * 0x80);
        local_358 = infinity();
        local_350 = local_9dc;
        local_360 = 0;
        local_2a8 = local_358;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (in_stack_fffffffffffff380,
                   (double)CONCAT44(in_stack_fffffffffffff37c,in_stack_fffffffffffff378),
                   (type *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370));
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x79ed80);
        if (tVar2) {
          local_180 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)(in_stack_00000010 + (long)local_54c * 0x80);
          local_188 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)(in_stack_00000008 + (long)local_54c * 0x80);
          local_178 = &local_a5c;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_189,local_180,local_188);
          local_170 = &local_a5c;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370));
          local_158 = &local_a5c;
          local_160 = local_180;
          local_168 = local_188;
          boost::multiprecision::default_ops::
          eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                     (cpp_dec_float<200U,_int,_void> *)0x79ee5e);
          local_ae0 = 0;
          tVar2 = boost::multiprecision::operator<=
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffff37c,in_stack_fffffffffffff378),
                             (int *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370));
          if (tVar2) {
            local_58 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)(in_RDI + 0x1b0);
            local_50 = &local_b60;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_59,local_58);
            local_40 = &local_b60;
            local_48 = local_58;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
            local_38 = &local_b60;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370));
            local_238 = local_adc;
            local_240 = &local_b60;
            local_248 = &local_5cc;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_249,local_240,local_248);
            local_230 = local_adc;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370));
            local_218 = local_adc;
            local_220 = local_240;
            local_228 = local_248;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                       (cpp_dec_float<200U,_int,_void> *)0x79efc8);
          }
          else {
            local_c8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)(in_RDI + 0x1b0);
            local_b8 = &local_c60;
            local_c0 = &local_a5c;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_c9,local_c0,local_c8);
            local_b0 = &local_c60;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370));
            local_98 = &local_c60;
            local_a0 = local_c0;
            local_a8 = local_c8;
            boost::multiprecision::default_ops::
            eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                       (cpp_dec_float<200U,_int,_void> *)0x79f07e);
            local_80 = &local_be0;
            local_88 = &local_c60;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_89,local_88);
            local_70 = &local_be0;
            local_78 = local_88;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
            local_68 = &local_be0;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370));
            local_278 = local_adc;
            local_280 = &local_be0;
            local_288 = &local_5cc;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_289,local_280,local_288);
            local_270 = local_adc;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370));
            local_258 = local_adc;
            local_260 = local_280;
            local_268 = local_288;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                       (cpp_dec_float<200U,_int,_void> *)0x79f1b9);
          }
          local_310 = local_4c0;
          local_318 = local_adc;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
          in_stack_fffffffffffff378 = local_54c;
          pBVar5 = Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
                   ::operator[]((Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
                                 *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                                in_stack_fffffffffffff36c);
          pBVar5->idx = in_stack_fffffffffffff378;
          in_stack_fffffffffffff37c = in_stack_00000020;
          pBVar5 = Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
                   ::operator[]((Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
                                 *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                                in_stack_fffffffffffff36c);
          pBVar5->src = in_stack_fffffffffffff37c;
          local_2d0 = Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
                      ::operator[]((Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
                                    *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                                   in_stack_fffffffffffff36c);
          local_2d8 = local_4c0;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
          tVar2 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x79f2ab);
          if (tVar2) {
            local_2e0 = local_440;
            local_2e8 = local_4c0;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
            *local_3a8 = *local_3a0;
          }
          *local_3a0 = *local_3a0 + 1;
        }
      }
    }
    in_stack_fffffffffffff374 = *local_3a0;
    iVar3 = Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
            ::size((Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
                    *)0x79f32c);
    if (iVar3 <= in_stack_fffffffffffff374) {
      Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
      ::reSize((Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
                *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
               in_stack_fffffffffffff36c);
    }
  }
  return;
}

Assistant:

void SPxBoundFlippingRT<R>::collectBreakpointsMin(
   int&                  nBp,                /**< number of found breakpoints so far */
   int&                  minIdx,             /**< index to current minimal breakpoint */
   const int*            idx,                /**< pointer to indices of current VectorBase<R> */
   int                   nnz,                /**< number of nonzeros in current VectorBase<R> */
   const R*           upd,                /**< pointer to update values of current VectorBase<R> */
   const R*           vec,                /**< pointer to values of current VectorBase<R> */
   const R*           upp,                /**< pointer to upper bound/rhs of current VectorBase<R> */
   const R*           low,                /**< pointer to lower bound/lhs of current VectorBase<R> */
   BreakpointSource      src                 /**< type of VectorBase<R> (pVec, coPvec or fVec)*/
)
{
   R minVal;
   R curVal;
   const int* last;

   minVal = (nBp == 0) ? R(infinity) : breakpoints[minIdx].val;

   last = idx + nnz;

   for(; idx < last; ++idx)
   {
      int i = *idx;
      R x = upd[i];

      if(x > this->epsilonZero())
      {
         if(low[i] > R(-infinity))
         {
            R y = low[i] - vec[i];

            curVal = (y >= 0) ? this->fastDelta / x : (this->fastDelta - y) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }
      else if(x < -this->epsilonZero())
      {
         if(upp[i] < R(infinity))
         {
            R y = upp[i] - vec[i];
            curVal = (y <= 0) ? -this->fastDelta / x : -(y + this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }

      if(nBp >= breakpoints.size())
         breakpoints.reSize(nBp * 2);
   }

   return;
}